

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveRight4update
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs,int *ridx,int rn,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *forest,int *forestNum,int *forestIdx)

{
  Status SVar1;
  long lVar2;
  bool bVar3;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RCX;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDX;
  long in_RDI;
  int *in_R8;
  int *in_R9;
  int in_stack_00000008;
  long in_stack_00000010;
  int *in_stack_00000018;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000020;
  int in_stack_0000006c;
  int *in_stack_00000070;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000078;
  int *in_stack_00000080;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000088;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000090;
  int *rperm_1;
  int k_1;
  int j_1;
  int i_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x_1;
  int *it;
  int *rperm;
  int k;
  int j;
  int i;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000330;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffffb78;
  cpp_dec_float<100U,_int,_void> *f;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffffb80;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffc18;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffc20;
  cpp_dec_float<100U,_int,_void> local_3cc;
  undefined4 local_37c;
  long local_2d8;
  int local_2d0;
  int local_2cc;
  int local_2c8;
  undefined4 local_274;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe1c;
  int *in_stack_fffffffffffffe20;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffe28;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffe30;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pCVar4;
  int local_1b8;
  int local_1b4;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffee8;
  
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  vSolveLright(in_RDX,in_RCX,in_R8,in_R9,in_stack_fffffffffffffee8);
  if (in_stack_00000010 == 0) {
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffffb80);
    local_2d8 = *(long *)(in_RDI + 0x1a8);
    local_2cc = 0;
    for (local_2c8 = 0; local_2c8 < in_stack_00000008; local_2c8 = local_2c8 + 1) {
      local_2d0 = in_R9[local_2c8];
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
      bVar3 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      if (bVar3) {
        enQueueMax(in_R9,&local_2cc,*(int *)(local_2d8 + (long)local_2d0 * 4));
      }
      else {
        local_37c = 0;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  (in_stack_fffffffffffffb80,(long_long_type)in_stack_fffffffffffffb78);
      }
    }
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffffb80);
    lVar2 = *(long *)(in_RDI + 0x1a8);
    local_1b8 = 0;
    in_stack_fffffffffffffe30 = in_stack_00000020;
    for (local_1b4 = 0; local_1b4 < in_stack_00000008; local_1b4 = local_1b4 + 1) {
      SVar1 = in_R9[local_1b4];
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
      bVar3 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      if (bVar3) {
        pCVar4 = (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)&in_stack_fffffffffffffe30->thedim;
        in_stack_fffffffffffffe30->stat = SVar1;
        enQueueMax(in_R9,&local_1b8,*(int *)(lVar2 + (long)(int)SVar1 * 4));
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
      }
      else {
        local_274 = 0;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  (in_stack_fffffffffffffb80,(long_long_type)in_stack_fffffffffffffb78);
        pCVar4 = in_stack_fffffffffffffe30;
      }
      in_stack_fffffffffffffe30 = pCVar4;
    }
    *in_stack_00000018 = local_1b8;
  }
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  f = &local_3cc;
  in_stack_00000008 =
       vSolveUright(in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078,
                    in_stack_00000070,in_stack_0000006c,in_stack_00000330);
  if (*(int *)(in_RDI + 0x208) == 0) {
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<100U,_int,_void> *)in_RDX,f);
    in_stack_00000008 =
         vSolveUpdateRight(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                           in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,
                           in_stack_fffffffffffffe10);
  }
  return in_stack_00000008;
}

Assistant:

int CLUFactor<R>::vSolveRight4update(R eps,
                                     R* vec, int* idx,                       /* result */
                                     R* rhs, int* ridx, int rn,              /* rhs    */
                                     R* forest, int* forestNum, int* forestIdx)
{
   vSolveLright(rhs, ridx, rn, eps);
   assert(rn >= 0 && rn <= thedim);

   /*  turn index list into a heap
    */

   if(forest)
   {
      R x;
      int i, j, k;
      int* rperm;
      int* it = forestIdx;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
      rn = vSolveUpdateRight(vec, idx, rn, eps);

   return rn;
}